

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O0

size_t htmlBufNodeDumpFormat(xmlBufPtr buf,xmlDocPtr doc,xmlNodePtr cur,int format)

{
  xmlOutputBufferPtr buf_00;
  size_t sVar1;
  size_t sVar2;
  xmlOutputBufferPtr outbuf;
  int ret;
  size_t use;
  int format_local;
  xmlNodePtr cur_local;
  xmlDocPtr doc_local;
  xmlBufPtr buf_local;
  
  if (cur == (xmlNodePtr)0x0) {
    buf_local = (xmlBufPtr)0xffffffffffffffff;
  }
  else if (buf == (xmlBufPtr)0x0) {
    buf_local = (xmlBufPtr)0xffffffffffffffff;
  }
  else {
    buf_00 = (xmlOutputBufferPtr)(*xmlMalloc)(0x38);
    if (buf_00 == (xmlOutputBufferPtr)0x0) {
      htmlSaveErrMemory("allocating HTML output buffer");
      buf_local = (xmlBufPtr)0xffffffffffffffff;
    }
    else {
      memset(buf_00,0,0x38);
      buf_00->buffer = buf;
      buf_00->encoder = (xmlCharEncodingHandlerPtr)0x0;
      buf_00->writecallback = (xmlOutputWriteCallback)0x0;
      buf_00->closecallback = (xmlOutputCloseCallback)0x0;
      buf_00->context = (void *)0x0;
      buf_00->written = 0;
      sVar1 = xmlBufUse(buf);
      htmlNodeDumpFormatOutput(buf_00,doc,cur,(char *)0x0,format);
      (*xmlFree)(buf_00);
      sVar2 = xmlBufUse(buf);
      buf_local = (xmlBufPtr)(long)((int)sVar2 - (int)sVar1);
    }
  }
  return (size_t)buf_local;
}

Assistant:

static size_t
htmlBufNodeDumpFormat(xmlBufPtr buf, xmlDocPtr doc, xmlNodePtr cur,
	           int format) {
    size_t use;
    int ret;
    xmlOutputBufferPtr outbuf;

    if (cur == NULL) {
	return (-1);
    }
    if (buf == NULL) {
	return (-1);
    }
    outbuf = (xmlOutputBufferPtr) xmlMalloc(sizeof(xmlOutputBuffer));
    if (outbuf == NULL) {
        htmlSaveErrMemory("allocating HTML output buffer");
	return (-1);
    }
    memset(outbuf, 0, (size_t) sizeof(xmlOutputBuffer));
    outbuf->buffer = buf;
    outbuf->encoder = NULL;
    outbuf->writecallback = NULL;
    outbuf->closecallback = NULL;
    outbuf->context = NULL;
    outbuf->written = 0;

    use = xmlBufUse(buf);
    htmlNodeDumpFormatOutput(outbuf, doc, cur, NULL, format);
    xmlFree(outbuf);
    ret = xmlBufUse(buf) - use;
    return (ret);
}